

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parsePrecAssignment(Parser *this)

{
  bool bVar1;
  pointer *__ptr;
  Parser *in_RSI;
  undefined1 local_58 [8];
  undefined1 local_50 [16];
  Token oper;
  
  parsePrecLogicalOr((Parser *)local_58);
  bVar1 = consume(in_RSI,EQUAL);
  if (bVar1) {
    Token::Token(&oper,&in_RSI->m_previous);
    parsePrecAssignment((Parser *)local_50);
    std::
    make_unique<enact::AssignExpr,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,enact::Token>
              ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)(local_50 + 8),
               (unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_58,
               (Token *)local_50);
    this->m_context = (CompileContext *)local_50._8_8_;
    if ((long *)local_50._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_50._0_8_ + 8))();
    }
    std::__cxx11::string::~string((string *)&oper.lexeme);
    if ((_Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>)local_58 != (Expr *)0x0)
    {
      (**(code **)(*(long *)local_58 + 8))();
    }
  }
  else {
    this->m_context = (CompileContext *)local_58;
  }
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parsePrecAssignment() {
        std::unique_ptr<Expr> expr = parsePrecLogicalOr();

        if (consume(TokenType::EQUAL)) {
            Token oper = m_previous;
            std::unique_ptr<Expr> rightExpr = parsePrecAssignment(); // Right-associative
            return std::make_unique<AssignExpr>(std::move(expr), std::move(rightExpr), std::move(oper));
        }

        return expr;
    }